

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O2

int __thiscall ktx::CommandExtract::OptionsExtract::init(OptionsExtract *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  OptionAdder *pOVar2;
  allocator<char> local_597;
  allocator<char> local_596;
  allocator<char> local_595;
  allocator<char> local_594;
  allocator<char> local_593;
  allocator<char> local_592;
  allocator<char> local_591;
  allocator<char> local_590;
  allocator<char> local_58f;
  allocator<char> local_58e;
  allocator<char> local_58d;
  allocator<char> local_58c;
  allocator<char> local_58b;
  allocator<char> local_58a;
  allocator<char> local_589;
  allocator<char> local_588;
  allocator<char> local_587;
  allocator<char> local_586;
  allocator<char> local_585;
  allocator<char> local_584;
  allocator<char> local_583;
  allocator<char> local_582;
  allocator<char> local_581;
  allocator<char> local_580;
  allocator<char> local_57f;
  allocator<char> local_57e;
  allocator<char> local_57d;
  allocator<char> local_57c;
  allocator<char> local_57b;
  allocator<char> local_57a;
  allocator<char> local_579;
  shared_ptr<const_cxxopts::Value> local_578;
  element_type *local_568;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_560;
  shared_ptr<const_cxxopts::Value> local_558;
  element_type *local_548;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_540;
  shared_ptr<const_cxxopts::Value> local_538;
  element_type *local_528;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_520;
  shared_ptr<const_cxxopts::Value> local_518;
  element_type *local_508;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_500;
  shared_ptr<const_cxxopts::Value> local_4f8;
  element_type *local_4e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_4e0;
  shared_ptr<const_cxxopts::Value> local_4d8;
  element_type *local_4c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_4c0;
  shared_ptr<const_cxxopts::Value> local_4b8;
  element_type *local_4a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_4a0;
  shared_ptr<const_cxxopts::Value> local_498;
  element_type *local_488;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_480;
  shared_ptr<const_cxxopts::Value> local_478;
  element_type *local_468;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_460;
  shared_ptr<const_cxxopts::Value> local_458;
  element_type *local_448;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_440;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  undefined1 local_78 [40];
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_579);
  cxxopts::Options::add_options((OptionAdder *)local_78,(Options *)ctx,&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,kOutput,&local_57a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "Output filepath for single, output directory for multiple image export.",&local_57b);
  cxxopts::value<std::__cxx11::string>();
  local_498.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_4a8;
  local_498.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_4a0._M_pi;
  local_4a8 = (element_type *)0x0;
  _Stack_4a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"<filepath>",&local_57c);
  pOVar2 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)local_78,&local_98,&local_b8,&local_498,&local_d8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,kStdout,&local_57d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,
             "Use stdout as the output file. (Using a single dash \'-\' as the output file has the same effect)"
             ,&local_57e);
  cxxopts::value<bool>();
  local_4b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_4c8;
  local_4b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_4c0._M_pi;
  local_4c8 = (element_type *)0x0;
  _Stack_4c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"",&local_57f);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_f8,&local_118,&local_4b8,&local_138);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,kTranscode,&local_580);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,
             "Transcode the texture to the target format before executing the extract steps. Requires the input file to be transcodable. Block compressed transcode targets can only be saved in raw format. Case-insensitive.\nPossible options are: etc-rgb | etc-rgba | eac-r11 | eac-rg11 | bc1 | bc3 | bc4 | bc5 | bc7 | astc | r8 | rg8 | rgb8 | rgba8.\netc-rgb is ETC1; etc-rgba, eac-r11 and eac-rg11 are ETC2."
             ,&local_581);
  cxxopts::value<std::__cxx11::string>();
  local_4d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_4e8;
  local_4d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_4e0._M_pi;
  local_4e8 = (element_type *)0x0;
  _Stack_4e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"<target>",&local_582);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_158,&local_178,&local_4d8,&local_198);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,kUri,&local_583);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"KTX Fragment URI.",&local_584);
  cxxopts::value<std::__cxx11::string>();
  local_4f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_508;
  local_4f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_500._M_pi;
  local_508 = (element_type *)0x0;
  _Stack_500._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"<uri>",&local_585);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_1b8,&local_1d8,&local_4f8,&local_1f8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,kLevel,&local_586);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,
             "Level to extract. When \'all\' is used every level is exported. Defaults to 0.",
             &local_587);
  cxxopts::value<std::__cxx11::string>();
  local_518.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_528;
  local_518.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_520._M_pi;
  local_528 = (element_type *)0x0;
  _Stack_520._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"[0-9]+ | all",&local_588)
  ;
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_218,&local_238,&local_518,&local_258);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,kLayer,&local_589);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,
             "Layer to extract. When \'all\' is used every layer is exported. Defaults to 0.",
             &local_58a);
  cxxopts::value<std::__cxx11::string>();
  local_538.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_548;
  local_538.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_540._M_pi;
  local_548 = (element_type *)0x0;
  _Stack_540._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"[0-9]+ | all",&local_58b)
  ;
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_278,&local_298,&local_538,&local_2b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,kFace,&local_58c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f8,
             "Face to extract. When \'all\' is used every face is exported. Defaults to 0.",
             &local_58d);
  cxxopts::value<std::__cxx11::string>();
  local_558.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_448;
  local_558.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_440._M_pi;
  local_448 = (element_type *)0x0;
  _Stack_440._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"[0-5] | all",&local_58e);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_2d8,&local_2f8,&local_558,&local_318);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,kDepth,&local_58f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,
             "Depth slice to extract. When \'all\' is used every depth is exported. Defaults to 0.",
             &local_590);
  cxxopts::value<std::__cxx11::string>();
  local_458.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_568;
  local_458.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_560._M_pi;
  local_568 = (element_type *)0x0;
  _Stack_560._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"[0-9]+ | all",&local_591)
  ;
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_338,&local_358,&local_458,&local_378);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,kAll,&local_592);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,"Extract every image slice from the texture.",&local_593);
  cxxopts::value<bool>();
  local_578.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_468;
  local_578.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_460._M_pi;
  local_468 = (element_type *)0x0;
  _Stack_460._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"",&local_594);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_398,&local_3b8,&local_578,&local_3d8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,kRaw,&local_595);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_418,"Extract the raw image data without any conversion.",&local_596);
  cxxopts::value<bool>();
  local_478.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_488;
  local_478.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_480._M_pi;
  local_488 = (element_type *)0x0;
  _Stack_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"",&local_597);
  cxxopts::OptionAdder::operator()(pOVar2,&local_3f8,&local_418,&local_478,&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_478.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_480);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_578.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_460);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_378);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_458.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_560);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_318);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_558.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_440);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_538.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_540);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_518.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_520);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_500);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_4e0);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_4c0);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_498.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_4a0);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)(local_78 + 8));
  iVar1 = std::__cxx11::string::~string((string *)&local_50);
  return iVar1;
}

Assistant:

void CommandExtract::OptionsExtract::init(cxxopts::Options& opts) {
    opts.add_options()
            (kOutput, "Output filepath for single, output directory for multiple image export.", cxxopts::value<std::string>(), "<filepath>")
            (kStdout, "Use stdout as the output file. (Using a single dash '-' as the output file has the same effect)")
            (kTranscode, "Transcode the texture to the target format before executing the extract steps."
                          " Requires the input file to be transcodable."
                          " Block compressed transcode targets can only be saved in raw format."
                          " Case-insensitive."
                          "\nPossible options are:"
                          " etc-rgb | etc-rgba | eac-r11 | eac-rg11 | bc1 | bc3 | bc4 | bc5 | bc7 | astc |"
                          " r8 | rg8 | rgb8 | rgba8."
                          "\netc-rgb is ETC1; etc-rgba, eac-r11 and eac-rg11 are ETC2.",
                          cxxopts::value<std::string>(), "<target>")
            (kUri, "KTX Fragment URI.", cxxopts::value<std::string>(), "<uri>")
            (kLevel, "Level to extract. When 'all' is used every level is exported. Defaults to 0.", cxxopts::value<std::string>(), "[0-9]+ | all")
            (kLayer, "Layer to extract. When 'all' is used every layer is exported. Defaults to 0.", cxxopts::value<std::string>(), "[0-9]+ | all")
            (kFace, "Face to extract. When 'all' is used every face is exported. Defaults to 0.", cxxopts::value<std::string>(), "[0-5] | all")
            (kDepth, "Depth slice to extract. When 'all' is used every depth is exported. Defaults to 0.", cxxopts::value<std::string>(), "[0-9]+ | all")
            (kAll, "Extract every image slice from the texture.")
            (kRaw, "Extract the raw image data without any conversion.");
}